

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

Vec_Ptr_t * Saig_ManBmcTerSimPo(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  uint *pPrev;
  uint iFrame;
  Aig_Man_t *pAVar3;
  
  pAVar3 = (Aig_Man_t *)0x64;
  p_00 = Vec_PtrAlloc(100);
  pPrev = (uint *)0x0;
  uVar1 = 0;
  do {
    iFrame = uVar1;
    if ((iFrame / 100) * 100 == iFrame) {
      Abc_Print((int)pAVar3,"Frame %5d\n",(ulong)iFrame);
    }
    pPrev = Saig_ManBmcTerSimOne(p,pPrev);
    Vec_PtrPush(p_00,pPrev);
    pAVar3 = p;
    iVar2 = Saig_ManBmcTerSimCount01Po(p,pPrev);
    uVar1 = iFrame + 1;
  } while (p->nTruePos <= iVar2);
  Abc_Print((int)pAVar3,"Detected terminary PO in frame %d.\n",(ulong)iFrame);
  Saig_ManBmcCountNonternary(p,p_00,iFrame);
  return p_00;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcTerSimPo( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    unsigned * pInfo = NULL;
    int i, nPoBin;
    vInfos = Vec_PtrAlloc( 100 );
    for ( i = 0; ; i++ )
    {
        if ( i % 100 == 0 )
            Abc_Print( 1, "Frame %5d\n", i );
        pInfo = Saig_ManBmcTerSimOne( p, pInfo );
        Vec_PtrPush( vInfos, pInfo );
        nPoBin = Saig_ManBmcTerSimCount01Po( p, pInfo );
        if ( nPoBin < Saig_ManPoNum(p) )
            break;
    }
    Abc_Print( 1, "Detected terminary PO in frame %d.\n", i );
    Saig_ManBmcCountNonternary( p, vInfos, i );
    return vInfos;
}